

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

Node * mainposition(Table *t,TValue *key)

{
  uint uVar1;
  Node *pNVar2;
  ulong uVar3;
  
  switch(key->tt) {
  case 1:
    uVar1 = ~(uint)(-1L << (t->lsizenode & 0x3f)) & (key->value).b;
    break;
  default:
    uVar3 = (ulong)(uint)(key->value).b % (~(-1L << (t->lsizenode & 0x3f)) | 1U);
    goto LAB_00107313;
  case 3:
    pNVar2 = hashnum(t,(key->value).n);
    return pNVar2;
  case 4:
    uVar1 = ~(uint)(-1L << (t->lsizenode & 0x3f)) & *(uint *)((long)(key->value).gc + 0xc);
  }
  uVar3 = (ulong)(int)uVar1;
LAB_00107313:
  return t->node + uVar3;
}

Assistant:

static Node*mainposition(const Table*t,const TValue*key){
switch(ttype(key)){
case 3:
return hashnum(t,nvalue(key));
case 4:
return hashstr(t,rawtsvalue(key));
case 1:
return hashboolean(t,bvalue(key));
case 2:
return hashpointer(t,pvalue(key));
default:
return hashpointer(t,gcvalue(key));
}
}